

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int amqpvalue_set_list_item_count(AMQP_VALUE value,uint32_t list_size)

{
  uint uVar1;
  void *pvVar2;
  AMQP_VALUE pAVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var4 = xlogging_get_log_function();
    iVar6 = 0x4ef;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x4ef;
    }
    pcVar7 = "NULL list value";
    iVar5 = 0x4ee;
  }
  else if (value->type == AMQP_TYPE_LIST) {
    uVar8 = (ulong)list_size;
    uVar1 = (value->value).binary_value.length;
    if (list_size <= uVar1) {
      if (uVar1 <= list_size) {
        return 0;
      }
      for (; uVar8 < uVar1; uVar8 = uVar8 + 1) {
        amqpvalue_destroy(*(AMQP_VALUE *)
                           (&((value->value).described_value.descriptor)->type + uVar8 * 2));
        uVar1 = (value->value).binary_value.length;
      }
      (value->value).binary_value.length = list_size;
      return 0;
    }
    pvVar2 = realloc((value->value).binary_value.bytes,uVar8 * 8);
    if (pvVar2 != (void *)0x0) {
      (value->value).binary_value.bytes = pvVar2;
      uVar9 = (ulong)(value->value).binary_value.length;
      while( true ) {
        if (uVar8 <= uVar9) {
          (value->value).binary_value.length = list_size;
          return 0;
        }
        pAVar3 = amqpvalue_create_null();
        *(AMQP_VALUE *)((long)pvVar2 + uVar9 * 8) = pAVar3;
        if (pAVar3 == (AMQP_VALUE)0x0) break;
        uVar9 = uVar9 + 1;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"amqpvalue_set_list_item_count",0x514,1,
                  "Could not create NULL AMQP value to be inserted in list");
      }
      for (uVar8 = (ulong)(value->value).binary_value.length; uVar8 < (uVar9 & 0xffffffff);
          uVar8 = uVar8 + 1) {
        amqpvalue_destroy(*(AMQP_VALUE *)((long)pvVar2 + uVar8 * 8));
      }
      return 0x522;
    }
    p_Var4 = xlogging_get_log_function();
    iVar6 = 0x507;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x507;
    }
    pcVar7 = "Could not reallocate list memory, size:%zu";
    iVar5 = 0x506;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    iVar6 = 0x4f8;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x4f8;
    }
    pcVar7 = "Value is not of type LIST";
    iVar5 = 0x4f7;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"amqpvalue_set_list_item_count",iVar5,1,pcVar7);
  return iVar6;
}

Assistant:

int amqpvalue_set_list_item_count(AMQP_VALUE value, uint32_t list_size)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_155: [If the value argument is NULL, amqpvalue_set_list_item_count shall return a non-zero value.] */
    if (value == NULL)
    {
        LogError("NULL list value");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if (value_data->type != AMQP_TYPE_LIST)
        {
            /* Codes_SRS_AMQPVALUE_01_156: [If the value is not of type list, then amqpvalue_set_list_item_count shall return a non-zero value.] */
            LogError("Value is not of type LIST");
            result = MU_FAILURE;
        }
        else
        {
            if (value_data->value.list_value.count < list_size)
            {
                AMQP_VALUE* new_list;

                /* Codes_SRS_AMQPVALUE_01_152: [amqpvalue_set_list_item_count shall resize an AMQP list.] */
                size_t realloc_size = safe_multiply_size_t(list_size, sizeof(AMQP_VALUE));
                if (realloc_size == SIZE_MAX ||
                    (new_list = (AMQP_VALUE*)realloc(value_data->value.list_value.items, realloc_size)) == NULL)
                {
                    /* Codes_SRS_AMQPVALUE_01_154: [If allocating memory for the list according to the new size fails, then amqpvalue_set_list_item_count shall return a non-zero value, while preserving the existing list contents.] */
                    LogError("Could not reallocate list memory, size:%zu", realloc_size);
                    result = MU_FAILURE;
                }
                else
                {
                    uint32_t i;
                    value_data->value.list_value.items = new_list;

                    /* Codes_SRS_AMQPVALUE_01_162: [When a list is grown a null AMQP_VALUE shall be inserted as new list items to fill the list up to the new size.] */
                    for (i = value_data->value.list_value.count; i < list_size; i++)
                    {
                        new_list[i] = amqpvalue_create_null();
                        if (new_list[i] == NULL)
                        {
                            LogError("Could not create NULL AMQP value to be inserted in list");
                            break;
                        }
                    }

                    if (i < list_size)
                    {
                        /* Codes_SRS_AMQPVALUE_01_154: [If allocating memory for the list according to the new size fails, then amqpvalue_set_list_item_count shall return a non-zero value, while preserving the existing list contents.] */
                        uint32_t j;
                        for (j = value_data->value.list_value.count; j < i; j++)
                        {
                            amqpvalue_destroy(new_list[j]);
                        }

                        result = MU_FAILURE;
                    }
                    else
                    {
                        value_data->value.list_value.count = list_size;

                        /* Codes_SRS_AMQPVALUE_01_153: [On success amqpvalue_set_list_item_count shall return 0.] */
                        result = 0;
                    }
                }
            }
            else if (value_data->value.list_value.count > list_size)
            {
                uint32_t i;

                /* Codes_SRS_AMQPVALUE_01_161: [When the list is shrunk, the extra items shall be freed by using amqp_value_destroy.] */
                for (i = list_size; i < value_data->value.list_value.count; i++)
                {
                    amqpvalue_destroy(value_data->value.list_value.items[i]);
                }

                value_data->value.list_value.count = list_size;

                /* Codes_SRS_AMQPVALUE_01_153: [On success amqpvalue_set_list_item_count shall return 0.] */
                result = 0;
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_153: [On success amqpvalue_set_list_item_count shall return 0.] */
                result = 0;
            }
        }
    }

    return result;
}